

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_test.cpp
# Opt level: O2

void __thiscall
vm_test_interpret_instr_mixed_Test::vm_test_interpret_instr_mixed_Test
          (vm_test_interpret_instr_mixed_Test *this)

{
  anon_unknown.dwarf_1947c::vm_test::vm_test(&this->super_vm_test);
  (this->super_vm_test).super_Test._vptr_Test = (_func_int **)&PTR__vm_test_001782d0;
  return;
}

Assistant:

TEST_F(vm_test, interpret_instr_mixed) {

  // test language with variant stack

  // push on unsigned stack
  EXPECT_EQ(vm3.interpret(prog_chunk({0x0})), status_type::SUCCESS);

  // push on double stack
  EXPECT_EQ(vm3.interpret(prog_chunk({0x1})), status_type::SUCCESS);

  // push ui32, push double, then add
  EXPECT_EQ(vm3.interpret(prog_chunk({0x2, 0x3, 0x4})), status_type::SUCCESS);
}